

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void closegoto(LexState *ls,int g,Labeldesc *label)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Dyndata *pDVar3;
  Labeldesc *pLVar4;
  undefined8 uVar5;
  long lVar6;
  LocVar *pLVar7;
  char *msg;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  pDVar3 = ls->dyd;
  lVar10 = (long)g;
  pLVar4 = (pDVar3->gt).arr;
  if (pLVar4[lVar10].name != label->name) {
    __assert_fail("((gt->name) == (label->name))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x315,"void closegoto(LexState *, int, Labeldesc *)");
  }
  pLVar4 = pLVar4 + lVar10;
  if (label->nactvar <= pLVar4->nactvar) {
    luaK_patchlist(ls->fs,pLVar4->pc,label->pc);
    uVar8 = (pDVar3->gt).n - 1;
    uVar9 = (ulong)uVar8;
    if (g < (int)uVar8) {
      lVar6 = lVar10 * 0x18;
      do {
        pLVar4 = (pDVar3->gt).arr;
        lVar10 = lVar10 + 1;
        *(undefined8 *)(&pLVar4->nactvar + lVar6) = *(undefined8 *)(&pLVar4[1].nactvar + lVar6);
        puVar2 = (undefined8 *)((long)&pLVar4[1].name + lVar6);
        uVar5 = puVar2[1];
        puVar1 = (undefined8 *)((long)&pLVar4->name + lVar6);
        *puVar1 = *puVar2;
        puVar1[1] = uVar5;
        lVar6 = lVar6 + 0x18;
        uVar9 = (long)(pDVar3->gt).n - 1;
      } while (lVar10 < (long)uVar9);
    }
    (pDVar3->gt).n = (int)uVar9;
    return;
  }
  pLVar7 = getlocvar(ls->fs,(uint)pLVar4->nactvar);
  msg = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",
                         pLVar4->name + 1,(ulong)(uint)pLVar4->line,pLVar7->varname + 1);
  semerror(ls,msg);
}

Assistant:

static void closegoto (LexState *ls, int g, Labeldesc *label) {
  int i;
  FuncState *fs = ls->fs;
  Labellist *gl = &ls->dyd->gt;
  Labeldesc *gt = &gl->arr[g];
  lua_assert(eqstr(gt->name, label->name));
  if (gt->nactvar < label->nactvar) {
    TString *vname = getlocvar(fs, gt->nactvar)->varname;
    const char *msg = luaO_pushfstring(ls->L,
      "<goto %s> at line %d jumps into the scope of local '%s'",
      getstr(gt->name), gt->line, getstr(vname));
    semerror(ls, msg);
  }
  luaK_patchlist(fs, gt->pc, label->pc);
  /* remove goto from pending list */
  for (i = g; i < gl->n - 1; i++)
    gl->arr[i] = gl->arr[i + 1];
  gl->n--;
}